

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *poVar2;
  pointer pSVar3;
  undefined1 local_58 [8];
  SourceLineInfo lineInfo;
  Colour colourGuard_1;
  
  if ((this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->super_StreamingReporterBase).m_sectionStack.
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo.
                           super_Option<Catch::TestCaseInfo>.nullableValue)->name);
    pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0x68)) {
      local_58[0] = false;
      Colour::use(Headers);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
        printHeaderString(this,&pSVar3->name,2);
      }
      Colour::~Colour((Colour *)local_58);
      pSVar3 = (this->super_StreamingReporterBase).m_sectionStack.
               super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_58,&pSVar3->lineInfo);
    if (lineInfo.file._M_dataplus._M_p != (pointer)0x0) {
      if (getLineOfChars<(char)45>()::line == '\0') {
        uRam0000000000180660 = 0x2d2d2d2d2d2d2d;
        uRam0000000000180667 = 0x2d2d2d2d2d2d2d2d;
        _DAT_00180650 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000180658 = 0x2d2d2d2d2d2d2d;
        DAT_0018065f = 0x2d;
        _DAT_00180640 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000180648 = 0x2d2d2d2d2d2d2d2d;
        _DAT_00180630 = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000180638 = 0x2d2d2d2d2d2d2d2d;
        _line = 0x2d2d2d2d2d2d2d2d;
        uRam0000000000180628 = 0x2d2d2d2d2d2d2d2d;
        DAT_0018066f = 0;
      }
      poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                               &getLineOfChars<(char)45>()::line);
      std::operator<<(poVar2,"\n");
      lineInfo.line._7_1_ = 0;
      Colour::use(FileName);
      poVar2 = (this->super_StreamingReporterBase).stream;
      operator<<(poVar2,(SourceLineInfo *)local_58);
      std::operator<<(poVar2,"\n");
      Colour::~Colour((Colour *)((long)&lineInfo.line + 7));
    }
    if (getLineOfChars<(char)46>()::line == '\0') {
      uRam00000000001806b0 = 0x2e2e2e2e2e2e2e;
      uRam00000000001806b7 = 0x2e2e2e2e2e2e2e2e;
      _DAT_001806a0 = 0x2e2e2e2e2e2e2e2e;
      uRam00000000001806a8 = 0x2e2e2e2e2e2e2e;
      DAT_001806af = 0x2e;
      _DAT_00180690 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000180698 = 0x2e2e2e2e2e2e2e2e;
      _DAT_00180680 = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000180688 = 0x2e2e2e2e2e2e2e2e;
      _line = 0x2e2e2e2e2e2e2e2e;
      uRam0000000000180678 = 0x2e2e2e2e2e2e2e2e;
      DAT_001806bf = 0;
    }
    poVar2 = std::operator<<((this->super_StreamingReporterBase).stream,
                             &getLineOfChars<(char)46>()::line);
    poVar2 = std::operator<<(poVar2,"\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_58);
    return;
  }
  __assert_fail("!m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/szborows[P]yebash/test/catch.hpp"
                ,0x2654,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
}

Assistant:

void printTestCaseAndSectionHeader() {
            assert( !m_sectionStack.empty() );
            printOpenHeader( currentTestCaseInfo->name );

            if( m_sectionStack.size() > 1 ) {
                Colour colourGuard( Colour::Headers );

                std::vector<SectionInfo>::const_iterator
                    it = m_sectionStack.begin()+1, // Skip first section (test case)
                    itEnd = m_sectionStack.end();
                for( ; it != itEnd; ++it )
                    printHeaderString( it->name, 2 );
            }

            SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

            if( !lineInfo.empty() ){
                stream << getLineOfChars<'-'>() << "\n";
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << "\n";
            }
            stream << getLineOfChars<'.'>() << "\n" << std::endl;
        }